

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O3

unique_ptr<PeerManager,_std::default_delete<PeerManager>_>
PeerManager::make(CConnman *connman,AddrMan *addrman,BanMan *banman,ChainstateManager *chainman,
                 CTxMemPool *pool,Warnings *warnings,Options opts)

{
  undefined8 *puVar1;
  TxReconciliationTracker *this;
  pointer *__ptr;
  pointer *__ptr_2;
  pointer __p;
  long in_FS_OFFSET;
  undefined1 in_stack_00000018;
  undefined1 uStack0000000000000019;
  byte in_stack_0000001d;
  undefined2 in_stack_0000001e;
  __uniq_ptr_impl<TxReconciliationTracker,_std::default_delete<TxReconciliationTracker>_> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar1 = (undefined8 *)operator_new(0x530);
  *puVar1 = &PTR_UpdatedBlockTip_013b6358;
  puVar1[1] = &PTR_InitializeNode_013b6450;
  FastRandomContext::FastRandomContext
            ((FastRandomContext *)(puVar1 + 2),(bool)(in_stack_0000001d & 1));
  local_40._M_t.
  super__Tuple_impl<0UL,_TxReconciliationTracker_*,_std::default_delete<TxReconciliationTracker>_>.
  super__Head_base<0UL,_TxReconciliationTracker_*,_false>._M_head_impl =
       (tuple<TxReconciliationTracker_*,_std::default_delete<TxReconciliationTracker>_>)
       (_Tuple_impl<0UL,_TxReconciliationTracker_*,_std::default_delete<TxReconciliationTracker>_>)
       0x3e8;
  FeeFilterRounder::FeeFilterRounder
            ((FeeFilterRounder *)(puVar1 + 0x13),(CFeeRate *)&local_40,
             (FastRandomContext *)(puVar1 + 2));
  puVar1[0x1f] = *(undefined8 *)&pool[3].m_load_tried;
  puVar1[0x20] = addrman;
  puVar1[0x21] = banman;
  puVar1[0x22] = chainman;
  puVar1[0x23] = pool;
  puVar1[0x24] = warnings;
  puVar1[0x25] = 0;
  puVar1[0x26] = 0;
  puVar1[0x27] = 0;
  puVar1[0x28] = 0;
  puVar1[0x29] = 0;
  TxRequestTracker::TxRequestTracker((TxRequestTracker *)(puVar1 + 0x2a),false);
  puVar1[0x2b] = 0;
  *(undefined4 *)(puVar1 + 0x2c) = 0xffffffff;
  puVar1[0x2d] = 0;
  puVar1[0x2e] = 0;
  puVar1[0x2f] = opts._0_8_;
  puVar1[0x30] = 0;
  puVar1[0x31] = 0;
  puVar1[0x32] = 0;
  puVar1[0x33] = 0;
  puVar1[0x34] = 0;
  puVar1[0x35] = 0;
  puVar1[0x36] = 0;
  puVar1[0x37] = 0;
  puVar1[0x38] = 0;
  puVar1[0x39] = 0;
  puVar1[0x3a] = 0;
  puVar1[0x3b] = 0;
  puVar1[0x3c] = 0;
  puVar1[0x3d] = 0;
  puVar1[0x3e] = 0;
  std::
  _Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ::_M_initialize_map((_Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                       *)(puVar1 + 0x35),0);
  puVar1[0x3f] = opts._0_8_;
  *(undefined1 *)(puVar1 + 0x40) = (undefined1)opts.max_extra_txs;
  *(undefined1 *)((long)puVar1 + 0x201) = opts.max_extra_txs._1_1_;
  *(ulong *)((long)puVar1 + 0x202) =
       CONCAT17(uStack0000000000000019,CONCAT16(in_stack_00000018,opts._10_6_));
  *(undefined4 *)((long)puVar1 + 0x209) = _uStack0000000000000019;
  *(byte *)((long)puVar1 + 0x20d) = in_stack_0000001d;
  *(undefined2 *)((long)puVar1 + 0x20e) = in_stack_0000001e;
  *(undefined1 *)(puVar1 + 0x42) = 0;
  puVar1[0x43] = 0;
  puVar1[0x44] = 0;
  puVar1[0x45] = 0;
  puVar1[0x46] = 0;
  puVar1[0x47] = 0;
  *(undefined4 *)(puVar1 + 0x49) = 0;
  puVar1[0x4a] = 0;
  puVar1[0x4b] = puVar1 + 0x49;
  puVar1[0x4c] = puVar1 + 0x49;
  puVar1[0x4d] = 0;
  *(undefined4 *)(puVar1 + 0x4f) = 0;
  puVar1[0x50] = 0;
  puVar1[0x51] = puVar1 + 0x4f;
  puVar1[0x52] = puVar1 + 0x4f;
  *(undefined4 *)(puVar1 + 0x5b) = 0;
  puVar1[0x5c] = 0;
  *(undefined4 *)(puVar1 + 0x59) = 0;
  puVar1[0x57] = 0;
  puVar1[0x58] = 0;
  puVar1[0x55] = 0;
  puVar1[0x56] = 0;
  puVar1[0x53] = 0;
  puVar1[0x54] = 0;
  puVar1[0x5d] = puVar1 + 0x5b;
  puVar1[0x5e] = puVar1 + 0x5b;
  puVar1[0x5f] = 0;
  puVar1[0x60] = 0;
  *(undefined4 *)(puVar1 + 0x61) = 0;
  puVar1[0x62] = 2;
  memset(puVar1 + 99,0,200);
  puVar1[0x7c] = puVar1 + 0x7a;
  puVar1[0x7d] = puVar1 + 0x7a;
  puVar1[0x7e] = 0;
  puVar1[0x7f] = 0xffffffffffffffff;
  *(undefined1 *)(puVar1 + 0x80) = 0;
  *(undefined4 *)((long)puVar1 + 0x404) = 0;
  *(undefined4 *)(puVar1 + 0x82) = 0;
  puVar1[0x83] = 0;
  puVar1[0x84] = puVar1 + 0x82;
  puVar1[0x85] = puVar1 + 0x82;
  puVar1[0x86] = 0;
  puVar1[0x87] = 0;
  puVar1[0x89] = puVar1 + 0x88;
  puVar1[0x88] = puVar1 + 0x88;
  puVar1[0x8a] = 0;
  *(undefined4 *)(puVar1 + 0x8b) = 0;
  *(undefined4 *)(puVar1 + 0x8d) = 0;
  puVar1[0x8e] = 0;
  puVar1[0x8f] = puVar1 + 0x8d;
  puVar1[0x90] = puVar1 + 0x8d;
  puVar1[0x91] = 0;
  *(undefined4 *)(puVar1 + 0x93) = 0;
  puVar1[0x94] = 0;
  puVar1[0x95] = puVar1 + 0x93;
  puVar1[0x96] = puVar1 + 0x93;
  puVar1[0x97] = 0;
  *(undefined4 *)(puVar1 + 0x99) = 0;
  puVar1[0x9a] = 0;
  puVar1[0x9b] = puVar1 + 0x99;
  puVar1[0x9c] = puVar1 + 0x99;
  puVar1[0xa5] = 0;
  puVar1[0xa3] = 0;
  puVar1[0xa4] = 0;
  puVar1[0xa1] = 0;
  puVar1[0xa2] = 0;
  puVar1[0x9f] = 0;
  puVar1[0xa0] = 0;
  puVar1[0x9d] = 0;
  puVar1[0x9e] = 0;
  if (((undefined1  [16])opts & (undefined1  [16])0x100) != (undefined1  [16])0x0) {
    this = (TxReconciliationTracker *)operator_new(8);
    TxReconciliationTracker::TxReconciliationTracker(this,1);
    local_40._M_t.
    super__Tuple_impl<0UL,_TxReconciliationTracker_*,_std::default_delete<TxReconciliationTracker>_>
    .super__Head_base<0UL,_TxReconciliationTracker_*,_false>._M_head_impl =
         (tuple<TxReconciliationTracker_*,_std::default_delete<TxReconciliationTracker>_>)
         (_Tuple_impl<0UL,_TxReconciliationTracker_*,_std::default_delete<TxReconciliationTracker>_>
         )0x0;
    std::__uniq_ptr_impl<TxReconciliationTracker,_std::default_delete<TxReconciliationTracker>_>::
    reset((__uniq_ptr_impl<TxReconciliationTracker,_std::default_delete<TxReconciliationTracker>_> *
          )(puVar1 + 0x2b),this);
    std::unique_ptr<TxReconciliationTracker,_std::default_delete<TxReconciliationTracker>_>::
    ~unique_ptr((unique_ptr<TxReconciliationTracker,_std::default_delete<TxReconciliationTracker>_>
                 *)&local_40);
  }
  (connman->m_total_bytes_sent_mutex).super_mutex.super___mutex_base._M_mutex.__align = (long)puVar1
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (__uniq_ptr_data<PeerManager,_std::default_delete<PeerManager>,_true,_true>)
           (__uniq_ptr_data<PeerManager,_std::default_delete<PeerManager>,_true,_true>)connman;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<PeerManager> PeerManager::make(CConnman& connman, AddrMan& addrman,
                                               BanMan* banman, ChainstateManager& chainman,
                                               CTxMemPool& pool, node::Warnings& warnings, Options opts)
{
    return std::make_unique<PeerManagerImpl>(connman, addrman, banman, chainman, pool, warnings, opts);
}